

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     bitfield_insert_invalid_insert_type(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderType shaderType_00;
  DataType baseDataType;
  ShaderType shaderType_01;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  bool bVar1;
  char *__s;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  string shaderSource;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  DataType in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  _Alloc_hider _Var6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  allocator<char> local_e1;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  long local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  _Var6._M_p = (pointer)&local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffef8,"bitfieldInsert: Invalid insert type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffef8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != &local_f8) {
    operator_delete(_Var6._M_p,local_f8._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_e1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x99df33);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar3) {
        local_f8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_f8._8_8_ = plVar2[3];
        _Var6._M_p = (pointer)&local_f8;
      }
      else {
        local_f8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        _Var6._M_p = (pointer)*plVar2;
      }
      sVar7 = plVar2[1];
      *plVar2 = (long)paVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffef8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_f8) {
        operator_delete(_Var6._M_p,local_f8._M_allocated_capacity + 1);
      }
      local_60 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        shaderType_00 = (&(anonymous_namespace)::s_intTypes)[lVar4];
        baseDataType = (&(anonymous_namespace)::s_floatTypes)[lVar4];
        uVar5 = 0x1b;
        (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                  ((string *)&stack0xfffffffffffffef8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,shaderType_00,baseDataType,TYPE_INT,
                   TYPE_INT,in_stack_fffffffffffffef0);
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>((string *)local_80,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffeec;
        shaderSource_00._M_dataplus._M_p._0_4_ = uVar5;
        shaderSource_00._M_string_length._0_4_ = in_stack_fffffffffffffef0;
        shaderSource_00._M_string_length._4_4_ = in_stack_fffffffffffffef4;
        shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
        shaderSource_00.field_2._8_8_ = sVar7;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_80[0],shaderSource_00);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_f8) {
          operator_delete(_Var6._M_p,local_f8._M_allocated_capacity + 1);
        }
        shaderType_01 = (&(anonymous_namespace)::s_uintTypes)[lVar4];
        uVar5 = 0x1b;
        local_58 = lVar4;
        (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                  ((string *)&stack0xfffffffffffffef8,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,shaderType_01,baseDataType,TYPE_INT,
                   TYPE_INT,in_stack_fffffffffffffef0);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>((string *)local_a0,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffeec;
        shaderSource_01._M_dataplus._M_p._0_4_ = uVar5;
        shaderSource_01._M_string_length._0_4_ = in_stack_fffffffffffffef0;
        shaderSource_01._M_string_length._4_4_ = in_stack_fffffffffffffef4;
        shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
        shaderSource_01.field_2._8_8_ = sVar7;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_a0[0],shaderSource_01);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_f8) {
          operator_delete(_Var6._M_p,local_f8._M_allocated_capacity + 1);
        }
        lVar4 = 0;
        do {
          if (shaderType_00 != *(ShaderType *)((long)&(anonymous_namespace)::s_intTypes + lVar4)) {
            uVar5 = 0x1b;
            (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                      ((string *)&stack0xfffffffffffffef8,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,shaderType_00,
                       *(ShaderType *)((long)&(anonymous_namespace)::s_intTypes + lVar4),TYPE_INT,
                       TYPE_INT,in_stack_fffffffffffffef0);
            local_c0[0] = local_b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c0,_Var6._M_p,_Var6._M_p + sVar7);
            shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffeec;
            shaderSource_02._M_dataplus._M_p._0_4_ = uVar5;
            shaderSource_02._M_string_length._0_4_ = in_stack_fffffffffffffef0;
            shaderSource_02._M_string_length._4_4_ = in_stack_fffffffffffffef4;
            shaderSource_02.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
            shaderSource_02.field_2._8_8_ = sVar7;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_c0[0],shaderSource_02);
            if (local_c0[0] != local_b0) {
              operator_delete(local_c0[0],local_b0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var6._M_p != &local_f8) {
              operator_delete(_Var6._M_p,local_f8._M_allocated_capacity + 1);
            }
            uVar5 = 0x1b;
            (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                      ((string *)&stack0xfffffffffffffef8,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,shaderType_01,
                       *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + lVar4),TYPE_INT,
                       TYPE_INT,in_stack_fffffffffffffef0);
            local_e0[0] = local_d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_e0,_Var6._M_p,_Var6._M_p + sVar7);
            shaderSource_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffeec;
            shaderSource_03._M_dataplus._M_p._0_4_ = uVar5;
            shaderSource_03._M_string_length._0_4_ = in_stack_fffffffffffffef0;
            shaderSource_03._M_string_length._4_4_ = in_stack_fffffffffffffef4;
            shaderSource_03.field_2._M_allocated_capacity = (size_type)_Var6._M_p;
            shaderSource_03.field_2._8_8_ = sVar7;
            verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                         (ShaderType)local_e0[0],shaderSource_03);
            if (local_e0[0] != local_d0) {
              operator_delete(local_e0[0],local_d0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var6._M_p != &local_f8) {
              operator_delete(_Var6._M_p,local_f8._M_allocated_capacity + 1);
            }
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x10);
        lVar4 = local_58 + 1;
      } while (lVar4 != 4);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_60;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void bitfield_insert_invalid_insert_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_floatTypes));

	ctx.beginSection("bitfieldInsert: Invalid insert type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], s_floatTypes[dataTypeNdx], glu::TYPE_INT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], s_floatTypes[dataTypeNdx], glu::TYPE_INT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx2)
				{
					if (s_intTypes[dataTypeNdx] == s_intTypes[dataTypeNdx2])
						continue;

					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx2], glu::TYPE_INT, glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx2], glu::TYPE_INT, glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}